

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::rust_namespace_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_type *ttype)

{
  bool bVar1;
  string sStack_38;
  
  bVar1 = std::operator!=(&ttype->program_->name_,&((this->super_t_generator).program_)->name_);
  if (bVar1) {
    rust_snake_case(&sStack_38,this,&ttype->program_->name_);
    std::operator+(__return_storage_ptr__,&sStack_38,"::");
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_namespace(t_type* ttype) {
  if (ttype->get_program()->get_name() != get_program()->get_name()) {
    return rust_snake_case(ttype->get_program()->get_name()) + "::";
  } else {
    return "";
  }
}